

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void * sqlite3DbRealloc(sqlite3 *db,void *p,u64 n)

{
  void *pvVar1;
  size_t __n;
  
  if (p == (void *)0x0) {
    pvVar1 = sqlite3DbMallocRawNN(db,n);
    return pvVar1;
  }
  if (p < (db->lookaside).pEnd) {
    if (p < (db->lookaside).pMiddle) {
      if (((db->lookaside).pStart <= p) && (n <= (db->lookaside).szTrue)) {
        return p;
      }
    }
    else if (n < 0x81) {
      return p;
    }
  }
  if (db->mallocFailed == '\0') {
    if ((p < (db->lookaside).pStart) || ((db->lookaside).pTrueEnd <= p)) {
      pvVar1 = sqlite3Realloc(p,n);
      if (pvVar1 != (void *)0x0) {
        return pvVar1;
      }
      sqlite3OomFault(db);
    }
    else {
      pvVar1 = sqlite3DbMallocRawNN(db,n);
      if (pvVar1 != (void *)0x0) {
        __n = 0x80;
        if (p < (db->lookaside).pMiddle) {
          __n = (size_t)(db->lookaside).szTrue;
        }
        memcpy(pvVar1,p,__n);
        if (p == (void *)0x0) {
          return pvVar1;
        }
        sqlite3DbFreeNN(db,p);
        return pvVar1;
      }
    }
  }
  return (void *)0x0;
}

Assistant:

SQLITE_PRIVATE void *sqlite3DbRealloc(sqlite3 *db, void *p, u64 n){
  assert( db!=0 );
  if( p==0 ) return sqlite3DbMallocRawNN(db, n);
  assert( sqlite3_mutex_held(db->mutex) );
  if( ((uptr)p)<(uptr)db->lookaside.pEnd ){
#ifndef SQLITE_OMIT_TWOSIZE_LOOKASIDE
    if( ((uptr)p)>=(uptr)db->lookaside.pMiddle ){
      if( n<=LOOKASIDE_SMALL ) return p;
    }else
#endif
    if( ((uptr)p)>=(uptr)db->lookaside.pStart ){
      if( n<=db->lookaside.szTrue ) return p;
    }
  }
  return dbReallocFinish(db, p, n);
}